

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<OrderedScreen*>,long_long>
               (reverse_iterator<OrderedScreen_*> first,longlong n,
               reverse_iterator<OrderedScreen_*> d_first)

{
  QPlatformScreen *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  _drmModeModeInfo *p_Var8;
  Data *pDVar9;
  QKmsPlane *pQVar10;
  qreal qVar11;
  qreal qVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  drmModePropertyPtr p_Var15;
  drmModePropertyBlobPtr p_Var16;
  QSize QVar17;
  OrderedScreen *pOVar18;
  OrderedScreen *pOVar19;
  OrderedScreen *pOVar20;
  OrderedScreen *pOVar21;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (OrderedScreen *)(d_first.current)->screen;
  pOVar20 = local_58.end.current + -n;
  pOVar21 = (OrderedScreen *)(first.current)->screen;
  pOVar19 = pOVar21;
  pOVar18 = pOVar20;
  if (pOVar20 < pOVar21) {
    pOVar19 = pOVar20;
    pOVar18 = pOVar21;
  }
  pOVar21 = (OrderedScreen *)(d_first.current)->screen;
  while (pOVar21 != pOVar18) {
    pQVar1 = (first.current)->screen;
    pOVar21[-1].screen = *(QPlatformScreen **)(pQVar1 + -0x100);
    uVar2 = *(undefined8 *)(pQVar1 + -0xf8);
    uVar3 = *(undefined8 *)(pQVar1 + -0xf3);
    pOVar21[-1].vinfo.virtualIndex = (int)uVar2;
    pOVar21[-1].vinfo.virtualPos.xp = (Representation)(int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)((long)&pOVar21[-1].vinfo.virtualPos.xp.m_i + 1) = uVar3;
    pDVar4 = *(Data **)(pQVar1 + -0xe8);
    *(undefined8 *)(pQVar1 + -0xe8) = 0;
    pOVar21[-1].vinfo.output.name.d.d = pDVar4;
    pcVar5 = *(char16_t **)(pQVar1 + -0xe0);
    *(undefined8 *)(pQVar1 + -0xe0) = 0;
    pOVar21[-1].vinfo.output.name.d.ptr = pcVar5;
    qVar6 = *(qsizetype *)(pQVar1 + -0xd8);
    *(undefined8 *)(pQVar1 + -0xd8) = 0;
    pOVar21[-1].vinfo.output.name.d.size = qVar6;
    uVar2 = *(undefined8 *)(pQVar1 + -0xd0);
    uVar3 = *(undefined8 *)(pQVar1 + -200);
    qVar11 = *(qreal *)(pQVar1 + -0xc0);
    qVar12 = *(qreal *)(pQVar1 + -0xb8);
    uVar13 = *(undefined8 *)(pQVar1 + -0xb0);
    uVar14 = *(undefined8 *)(pQVar1 + -0xa8);
    pOVar21[-1].vinfo.output.connector_id = (int)uVar2;
    pOVar21[-1].vinfo.output.crtc_index = (int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)&pOVar21[-1].vinfo.output.crtc_id = uVar3;
    pOVar21[-1].vinfo.output.physical_size.wd = qVar11;
    pOVar21[-1].vinfo.output.physical_size.ht = qVar12;
    pOVar21[-1].vinfo.output.preferred_mode = (int)uVar13;
    pOVar21[-1].vinfo.output.mode = (int)((ulong)uVar13 >> 0x20);
    *(undefined8 *)&pOVar21[-1].vinfo.output.mode_set = uVar14;
    pOVar21[-1].vinfo.output.saved_crtc = *(drmModeCrtcPtr *)(pQVar1 + -0xa0);
    pDVar7 = *(Data **)(pQVar1 + -0x98);
    *(undefined8 *)(pQVar1 + -0x98) = 0;
    pOVar21[-1].vinfo.output.modes.d.d = pDVar7;
    p_Var8 = *(_drmModeModeInfo **)(pQVar1 + -0x90);
    *(undefined8 *)(pQVar1 + -0x90) = 0;
    pOVar21[-1].vinfo.output.modes.d.ptr = p_Var8;
    qVar6 = *(qsizetype *)(pQVar1 + -0x88);
    *(undefined8 *)(pQVar1 + -0x88) = 0;
    pOVar21[-1].vinfo.output.modes.d.size = qVar6;
    p_Var15 = *(drmModePropertyPtr *)(pQVar1 + -0x78);
    p_Var16 = *(drmModePropertyBlobPtr *)(pQVar1 + -0x70);
    uVar2 = *(undefined8 *)(pQVar1 + -0x68);
    uVar3 = *(undefined8 *)(pQVar1 + -0x67);
    uVar13 = *(undefined8 *)(pQVar1 + -0x5f);
    *(undefined8 *)&pOVar21[-1].vinfo.output.subpixel = *(undefined8 *)(pQVar1 + -0x80);
    pOVar21[-1].vinfo.output.dpms_prop = p_Var15;
    pOVar21[-1].vinfo.output.edid_blob = p_Var16;
    pOVar21[-1].vinfo.output.wants_forced_plane = (bool)(char)uVar2;
    *(int3 *)&pOVar21[-1].vinfo.output.field_0x81 = (int3)((ulong)uVar2 >> 8);
    pOVar21[-1].vinfo.output.forced_plane_id = (int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)&pOVar21[-1].vinfo.output.field_0x81 = uVar3;
    *(undefined8 *)&pOVar21[-1].vinfo.output.field_0x89 = uVar13;
    pDVar4 = *(Data **)(pQVar1 + -0x50);
    *(undefined8 *)(pQVar1 + -0x50) = 0;
    pOVar21[-1].vinfo.output.clone_source.d.d = pDVar4;
    pcVar5 = *(char16_t **)(pQVar1 + -0x48);
    *(undefined8 *)(pQVar1 + -0x48) = 0;
    pOVar21[-1].vinfo.output.clone_source.d.ptr = pcVar5;
    qVar6 = *(qsizetype *)(pQVar1 + -0x40);
    *(undefined8 *)(pQVar1 + -0x40) = 0;
    pOVar21[-1].vinfo.output.clone_source.d.size = qVar6;
    pDVar9 = *(Data **)(pQVar1 + -0x38);
    *(undefined8 *)(pQVar1 + -0x38) = 0;
    pOVar21[-1].vinfo.output.available_planes.d.d = pDVar9;
    pQVar10 = *(QKmsPlane **)(pQVar1 + -0x30);
    *(undefined8 *)(pQVar1 + -0x30) = 0;
    pOVar21[-1].vinfo.output.available_planes.d.ptr = pQVar10;
    qVar6 = *(qsizetype *)(pQVar1 + -0x28);
    *(undefined8 *)(pQVar1 + -0x28) = 0;
    pOVar21[-1].vinfo.output.available_planes.d.size = qVar6;
    QVar17 = *(QSize *)(pQVar1 + -0x18);
    uVar2 = *(undefined8 *)(pQVar1 + -0x10);
    uVar3 = *(undefined8 *)(pQVar1 + -8);
    pOVar21[-1].vinfo.output.eglfs_plane = *(QKmsPlane **)(pQVar1 + -0x20);
    pOVar21[-1].vinfo.output.size = QVar17;
    pOVar21[-1].vinfo.output.crtcIdPropertyId = (int)uVar2;
    pOVar21[-1].vinfo.output.modeIdPropertyId = (int)((ulong)uVar2 >> 0x20);
    pOVar21[-1].vinfo.output.activePropertyId = (int)uVar3;
    pOVar21[-1].vinfo.output.mode_blob_id = (int)((ulong)uVar3 >> 0x20);
    (d_first.current)->screen = (d_first.current)->screen + -0x100;
    (first.current)->screen = (first.current)->screen + -0x100;
    pOVar21 = (OrderedScreen *)(d_first.current)->screen;
  }
  local_58.intermediate.current = (OrderedScreen *)(d_first.current)->screen;
  pOVar21 = (OrderedScreen *)(d_first.current)->screen;
  while (pOVar21 != pOVar20) {
    pQVar1 = (first.current)->screen;
    pOVar21[-1].screen = *(QPlatformScreen **)(pQVar1 + -0x100);
    uVar2 = *(undefined8 *)(pQVar1 + -0xf8);
    uVar3 = *(undefined8 *)(pQVar1 + -0xf3);
    pOVar21[-1].vinfo.virtualIndex = (int)uVar2;
    pOVar21[-1].vinfo.virtualPos.xp = (Representation)(int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)((long)&pOVar21[-1].vinfo.virtualPos.xp.m_i + 1) = uVar3;
    pDVar4 = pOVar21[-1].vinfo.output.name.d.d;
    pOVar21[-1].vinfo.output.name.d.d = *(Data **)(pQVar1 + -0xe8);
    *(Data **)(pQVar1 + -0xe8) = pDVar4;
    pcVar5 = pOVar21[-1].vinfo.output.name.d.ptr;
    pOVar21[-1].vinfo.output.name.d.ptr = *(char16_t **)(pQVar1 + -0xe0);
    *(char16_t **)(pQVar1 + -0xe0) = pcVar5;
    qVar6 = pOVar21[-1].vinfo.output.name.d.size;
    pOVar21[-1].vinfo.output.name.d.size = *(qsizetype *)(pQVar1 + -0xd8);
    *(qsizetype *)(pQVar1 + -0xd8) = qVar6;
    pOVar21[-1].vinfo.output.saved_crtc = *(drmModeCrtcPtr *)(pQVar1 + -0xa0);
    uVar2 = *(undefined8 *)(pQVar1 + -0xd0);
    uVar3 = *(undefined8 *)(pQVar1 + -200);
    qVar11 = *(qreal *)(pQVar1 + -0xc0);
    qVar12 = *(qreal *)(pQVar1 + -0xb8);
    uVar13 = *(undefined8 *)(pQVar1 + -0xb0);
    uVar14 = *(undefined8 *)(pQVar1 + -0xa8);
    pOVar21[-1].vinfo.output.preferred_mode = (int)uVar13;
    pOVar21[-1].vinfo.output.mode = (int)((ulong)uVar13 >> 0x20);
    *(undefined8 *)&pOVar21[-1].vinfo.output.mode_set = uVar14;
    pOVar21[-1].vinfo.output.physical_size.wd = qVar11;
    pOVar21[-1].vinfo.output.physical_size.ht = qVar12;
    pOVar21[-1].vinfo.output.connector_id = (int)uVar2;
    pOVar21[-1].vinfo.output.crtc_index = (int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)&pOVar21[-1].vinfo.output.crtc_id = uVar3;
    QArrayDataPointer<_drmModeModeInfo>::operator=
              (&pOVar21[-1].vinfo.output.modes.d,
               (QArrayDataPointer<_drmModeModeInfo> *)(pQVar1 + -0x98));
    p_Var15 = *(drmModePropertyPtr *)(pQVar1 + -0x78);
    p_Var16 = *(drmModePropertyBlobPtr *)(pQVar1 + -0x70);
    uVar2 = *(undefined8 *)(pQVar1 + -0x68);
    uVar3 = *(undefined8 *)(pQVar1 + -0x67);
    uVar13 = *(undefined8 *)(pQVar1 + -0x5f);
    *(undefined8 *)&pOVar21[-1].vinfo.output.subpixel = *(undefined8 *)(pQVar1 + -0x80);
    pOVar21[-1].vinfo.output.dpms_prop = p_Var15;
    pOVar21[-1].vinfo.output.edid_blob = p_Var16;
    pOVar21[-1].vinfo.output.wants_forced_plane = (bool)(char)uVar2;
    *(int3 *)&pOVar21[-1].vinfo.output.field_0x81 = (int3)((ulong)uVar2 >> 8);
    pOVar21[-1].vinfo.output.forced_plane_id = (int)((ulong)uVar2 >> 0x20);
    *(undefined8 *)&pOVar21[-1].vinfo.output.field_0x81 = uVar3;
    *(undefined8 *)&pOVar21[-1].vinfo.output.field_0x89 = uVar13;
    pDVar4 = pOVar21[-1].vinfo.output.clone_source.d.d;
    pOVar21[-1].vinfo.output.clone_source.d.d = *(Data **)(pQVar1 + -0x50);
    *(Data **)(pQVar1 + -0x50) = pDVar4;
    pcVar5 = pOVar21[-1].vinfo.output.clone_source.d.ptr;
    pOVar21[-1].vinfo.output.clone_source.d.ptr = *(char16_t **)(pQVar1 + -0x48);
    *(char16_t **)(pQVar1 + -0x48) = pcVar5;
    qVar6 = pOVar21[-1].vinfo.output.clone_source.d.size;
    pOVar21[-1].vinfo.output.clone_source.d.size = *(qsizetype *)(pQVar1 + -0x40);
    *(qsizetype *)(pQVar1 + -0x40) = qVar6;
    QArrayDataPointer<QKmsPlane>::operator=
              (&pOVar21[-1].vinfo.output.available_planes.d,
               (QArrayDataPointer<QKmsPlane> *)(pQVar1 + -0x38));
    QVar17 = *(QSize *)(pQVar1 + -0x18);
    uVar2 = *(undefined8 *)(pQVar1 + -0x10);
    uVar3 = *(undefined8 *)(pQVar1 + -8);
    pOVar21[-1].vinfo.output.eglfs_plane = *(QKmsPlane **)(pQVar1 + -0x20);
    pOVar21[-1].vinfo.output.size = QVar17;
    pOVar21[-1].vinfo.output.crtcIdPropertyId = (int)uVar2;
    pOVar21[-1].vinfo.output.modeIdPropertyId = (int)((ulong)uVar2 >> 0x20);
    pOVar21[-1].vinfo.output.activePropertyId = (int)uVar3;
    pOVar21[-1].vinfo.output.mode_blob_id = (int)((ulong)uVar3 >> 0x20);
    (d_first.current)->screen = (d_first.current)->screen + -0x100;
    (first.current)->screen = (first.current)->screen + -0x100;
    pOVar21 = (OrderedScreen *)(d_first.current)->screen;
  }
  local_58.iter = &local_58.end;
  pOVar21 = (OrderedScreen *)(first.current)->screen;
  while (pOVar21 != pOVar19) {
    (first.current)->screen = (QPlatformScreen *)(pOVar21 + 1);
    QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&(pOVar21->vinfo).output.available_planes.d);
    pDVar4 = (pOVar21->vinfo).output.clone_source.d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pOVar21->vinfo).output.clone_source.d.d)->super_QArrayData,2,0x10)
        ;
      }
    }
    pDVar7 = (pOVar21->vinfo).output.modes.d.d;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pOVar21->vinfo).output.modes.d.d)->super_QArrayData,0x44,0x10);
      }
    }
    pDVar4 = (pOVar21->vinfo).output.name.d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pOVar21->vinfo).output.name.d.d)->super_QArrayData,2,0x10);
      }
    }
    pOVar21 = (OrderedScreen *)(first.current)->screen;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<OrderedScreen_*>,_long_long>::Destructor::
  ~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}